

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O2

bool __thiscall
DIS::ElectromagneticEmissionsPdu::operator==
          (ElectromagneticEmissionsPdu *this,ElectromagneticEmissionsPdu *rhs)

{
  pointer pEVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t idx;
  ulong uVar5;
  long lVar6;
  
  bVar2 = DistributedEmissionsFamilyPdu::operator==
                    (&this->super_DistributedEmissionsFamilyPdu,
                     &rhs->super_DistributedEmissionsFamilyPdu);
  bVar3 = EntityID::operator==(&this->_emittingEntityID,&rhs->_emittingEntityID);
  bVar4 = EventID::operator==(&this->_eventID,&rhs->_eventID);
  bVar2 = this->_paddingForEmissionsPdu == rhs->_paddingForEmissionsPdu &&
          (this->_stateUpdateIndicator == rhs->_stateUpdateIndicator && (bVar4 && (bVar3 && bVar2)))
  ;
  lVar6 = 0;
  for (uVar5 = 0;
      pEVar1 = (this->_systems).
               super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->_systems).
                             super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x50);
      uVar5 = uVar5 + 1) {
    bVar3 = ElectromagneticEmissionSystemData::operator==
                      ((ElectromagneticEmissionSystemData *)
                       ((long)&pEVar1->_vptr_ElectromagneticEmissionSystemData + lVar6),
                       (ElectromagneticEmissionSystemData *)
                       ((long)&((rhs->_systems).
                                super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               _vptr_ElectromagneticEmissionSystemData + lVar6));
    bVar2 = (bool)(bVar2 & bVar3);
    lVar6 = lVar6 + 0x50;
  }
  return bVar2;
}

Assistant:

bool ElectromagneticEmissionsPdu::operator ==(const ElectromagneticEmissionsPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = DistributedEmissionsFamilyPdu::operator==(rhs);

     if( ! (_emittingEntityID == rhs._emittingEntityID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_stateUpdateIndicator == rhs._stateUpdateIndicator) ) ivarsEqual = false;
     if( ! (_paddingForEmissionsPdu == rhs._paddingForEmissionsPdu) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _systems.size(); idx++)
     {
        if( ! ( _systems[idx] == rhs._systems[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }